

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arcflowsol.cpp
# Opt level: O0

void __thiscall ArcflowSol::print_solution(ArcflowSol *this,bool print_inst,bool pyout)

{
  bool bVar1;
  bool bVar2;
  uint *puVar3;
  reference pvVar4;
  pointer ppVar5;
  reference pvVar6;
  iterator iVar7;
  iterator iVar8;
  reference ppVar9;
  int_pair *p_1;
  iterator __end4_1;
  iterator __begin4_1;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *__range4_1;
  pair<int,_int> local_154;
  int local_14c;
  int local_148;
  int i_1;
  int opt_1;
  int t_3;
  int_pair *itpair_1;
  const_iterator __end4;
  const_iterator __begin4;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *__range4;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> tmp_1;
  pattern_pair *pat_1;
  iterator __end3_2;
  iterator __begin3_2;
  vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
  *__range3_2;
  vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
  *sol_1;
  int t_2;
  int_pair *p;
  iterator __end3_1;
  iterator __begin3_1;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *__range3_1;
  bool first;
  pair<int,_int> local_8c;
  int local_84;
  int local_80;
  int i;
  int opt;
  int t_1;
  int_pair *itpair;
  const_iterator __end3;
  const_iterator __begin3;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *__range3;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> tmp;
  pattern_pair *pat;
  iterator __end2;
  iterator __begin2;
  vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
  *__range2;
  vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
  *sol;
  int t;
  bool pyout_local;
  bool print_inst_local;
  ArcflowSol *this_local;
  
  printf("Objective: %d\n",(ulong)(uint)this->objvalue);
  printf("Solution:\n");
  for (sol._0_4_ = 0; (int)sol < (this->inst).nbtypes; sol._0_4_ = (int)sol + 1) {
    if (1 < (this->inst).nbtypes) {
      puVar3 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                 (&this->nbins,(long)(int)sol);
      printf("Bins of type %d: %d\n",(ulong)((int)sol + 1),(ulong)*puVar3);
    }
    pvVar4 = std::
             vector<std::vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>,_std::allocator<std::vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>_>_>
             ::operator[](&this->sols,(long)(int)sol);
    __end2 = std::
             vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
             ::begin(pvVar4);
    pat = (pattern_pair *)
          std::
          vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
          ::end(pvVar4);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_*,_std::vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>_>
                                  *)&pat);
      if (!bVar1) break;
      tmp.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)__gnu_cxx::
                    __normal_iterator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_*,_std::vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>_>
                    ::operator*(&__end2);
      std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
                ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&__range3);
      ppVar5 = tmp.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage + 1;
      __end3 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin
                         ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                          ppVar5);
      itpair = (int_pair *)
               std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end
                         ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                          ppVar5);
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          (&__end3,(__normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                                    *)&itpair);
        if (!bVar1) break;
        _opt = __gnu_cxx::
               __normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
               ::operator*(&__end3);
        pvVar6 = std::vector<Item,_std::allocator<Item>_>::operator[]
                           (&(this->inst).items,(long)_opt->first);
        i = pvVar6->type;
        pvVar6 = std::vector<Item,_std::allocator<Item>_>::operator[]
                           (&(this->inst).items,(long)_opt->first);
        local_80 = pvVar6->opt;
        for (local_84 = 0; local_84 < _opt->second; local_84 = local_84 + 1) {
          local_8c = std::make_pair<int&,int&>(&i,&local_80);
          std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::push_back
                    ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&__range3
                     ,&local_8c);
        }
        __gnu_cxx::
        __normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
        ::operator++(&__end3);
      }
      iVar7 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin
                        ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                         &__range3);
      iVar8 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end
                        ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                         &__range3);
      std::
      sort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
                ((__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                  )iVar7._M_current,
                 (__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                  )iVar8._M_current);
      printf("%d x [",(ulong)(uint)(tmp.
                                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage)->first);
      bVar1 = true;
      __end3_1 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin
                           ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                            &__range3);
      p = (int_pair *)
          std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end
                    ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&__range3
                    );
      while( true ) {
        bVar2 = __gnu_cxx::operator!=
                          (&__end3_1,
                           (__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                            *)&p);
        if (!bVar2) break;
        ppVar9 = __gnu_cxx::
                 __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                 ::operator*(&__end3_1);
        if (bVar1) {
          bVar1 = false;
        }
        else {
          printf(", ");
        }
        if (ppVar9->second == -1) {
          printf("i=%d",(ulong)(ppVar9->first + 1));
        }
        else {
          printf("i=%d opt=%d",(ulong)(ppVar9->first + 1),(ulong)(ppVar9->second + 1));
        }
        __gnu_cxx::
        __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
        ::operator++(&__end3_1);
      }
      printf("]\n");
      std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~vector
                ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&__range3);
      __gnu_cxx::
      __normal_iterator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_*,_std::vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>_>
      ::operator++(&__end2);
    }
  }
  if (print_inst) {
    Instance::print(&this->inst);
  }
  if (pyout) {
    printf("PYSOL=(%d,[",(ulong)(uint)this->objvalue);
    for (sol_1._4_4_ = 0; sol_1._4_4_ < (this->inst).nbtypes; sol_1._4_4_ = sol_1._4_4_ + 1) {
      printf("[");
      pvVar4 = std::
               vector<std::vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>,_std::allocator<std::vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>_>_>
               ::operator[](&this->sols,(long)sol_1._4_4_);
      __end3_2 = std::
                 vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
                 ::begin(pvVar4);
      pat_1 = (pattern_pair *)
              std::
              vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
              ::end(pvVar4);
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          (&__end3_2,
                           (__normal_iterator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_*,_std::vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>_>
                            *)&pat_1);
        if (!bVar1) break;
        tmp_1.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage =
             (pointer)__gnu_cxx::
                      __normal_iterator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_*,_std::vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>_>
                      ::operator*(&__end3_2);
        std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
                  ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&__range4);
        ppVar5 = tmp_1.
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage + 1;
        __end4 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin
                           ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                            ppVar5);
        itpair_1 = (int_pair *)
                   std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end
                             ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                              ppVar5);
        while( true ) {
          bVar1 = __gnu_cxx::operator!=
                            (&__end4,(__normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                                      *)&itpair_1);
          if (!bVar1) break;
          _opt_1 = __gnu_cxx::
                   __normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                   ::operator*(&__end4);
          pvVar6 = std::vector<Item,_std::allocator<Item>_>::operator[]
                             (&(this->inst).items,(long)_opt_1->first);
          i_1 = pvVar6->type;
          pvVar6 = std::vector<Item,_std::allocator<Item>_>::operator[]
                             (&(this->inst).items,(long)_opt_1->first);
          local_148 = pvVar6->opt;
          for (local_14c = 0; local_14c < _opt_1->second; local_14c = local_14c + 1) {
            local_154 = std::make_pair<int&,int&>(&i_1,&local_148);
            std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::push_back
                      ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                       &__range4,&local_154);
          }
          __gnu_cxx::
          __normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
          ::operator++(&__end4);
        }
        iVar7 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin
                          ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                           &__range4);
        iVar8 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end
                          ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                           &__range4);
        std::
        sort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
                  ((__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                    )iVar7._M_current,
                   (__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                    )iVar8._M_current);
        printf("(%d,[",(ulong)(uint)(tmp_1.
                                     super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->first);
        __end4_1 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin
                             ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                              &__range4);
        p_1 = (int_pair *)
              std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end
                        ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                         &__range4);
        while( true ) {
          bVar1 = __gnu_cxx::operator!=
                            (&__end4_1,
                             (__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                              *)&p_1);
          if (!bVar1) break;
          ppVar9 = __gnu_cxx::
                   __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                   ::operator*(&__end4_1);
          if (ppVar9->second == -1) {
            printf("(%d, 0),",(ulong)(uint)ppVar9->first);
          }
          else {
            printf("(%d, %d),",(ulong)(uint)ppVar9->first,(ulong)(uint)ppVar9->second);
          }
          __gnu_cxx::
          __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
          ::operator++(&__end4_1);
        }
        printf("]),");
        std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~vector
                  ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&__range4);
        __gnu_cxx::
        __normal_iterator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_*,_std::vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>_>
        ::operator++(&__end3_2);
      }
      printf("],");
    }
    printf("])\n");
  }
  return;
}

Assistant:

void ArcflowSol::print_solution(bool print_inst = true, bool pyout = false) {
	printf("Objective: %d\n", objvalue);
	printf("Solution:\n");
	for (int t = 0; t < inst.nbtypes; t++) {
		if (inst.nbtypes > 1) {
			printf("Bins of type %d: %d\n", t + 1, nbins[t]);
		}
		std::vector<pattern_pair> &sol = sols[t];
		for (const pattern_pair &pat : sol) {
			std::vector<int_pair> tmp;
			for (const int_pair &itpair : pat.second) {
				int t = inst.items[itpair.first].type;
				int opt = inst.items[itpair.first].opt;
				for (int i = 0; i < itpair.second; i++) {
					tmp.push_back(MP(t, opt));
				}
			}
			sort(all(tmp));
			printf("%d x [", pat.first);
			bool first = true;
			for (const int_pair &p : tmp) {
				if (first) {
					first = false;
				} else {
					printf(", ");
				}
				if (p.second == -1) {
					printf("i=%d", p.first + 1);
				} else {
					printf("i=%d opt=%d", p.first + 1, p.second + 1);
				}
			}
			printf("]\n");
		}
	}

	if (print_inst) {
		inst.print();
	}

	if (pyout) {
		printf("PYSOL=(%d,[", objvalue);
		for (int t = 0; t < inst.nbtypes; t++) {
			printf("[");
			std::vector<pattern_pair> &sol = sols[t];
			for (const pattern_pair &pat : sol) {
				std::vector<int_pair> tmp;
				for (const int_pair &itpair : pat.second) {
					int t = inst.items[itpair.first].type;
					int opt = inst.items[itpair.first].opt;
					for (int i = 0; i < itpair.second; i++) {
						tmp.push_back(MP(t, opt));
					}
				}
				sort(all(tmp));

				printf("(%d,[", pat.first);
				for (const int_pair &p : tmp) {
					if (p.second == -1) {
						printf("(%d, 0),", p.first);
					} else {
						printf("(%d, %d),", p.first, p.second);
					}
				}
				printf("]),");
			}
			printf("],");
		}
		printf("])\n");
	}
}